

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  Message *pMVar4;
  pointer pMVar5;
  string *this_00;
  MessageLite *this_01;
  Type *v1;
  Type *v2;
  char *failure_msg;
  LogMessage *pLVar6;
  UnknownFieldSet *pUVar7;
  string_view sVar8;
  UnknownFieldSet *group;
  Voidify local_181;
  Type local_180;
  Type local_17c;
  Nullable<const_char_*> local_178;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *local_168;
  undefined1 local_160 [8];
  string serial;
  anon_class_16_2_d22cc028 local_138;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_128;
  string_view local_118;
  undefined1 local_108 [8];
  Parser parser;
  AggregateOptionFinder finder;
  AggregateErrorCollector collector;
  string local_98;
  byte local_75;
  LogMessage local_68;
  Voidify local_51;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_50;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> dynamic;
  Descriptor *type;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_38;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  FieldDescriptor *option_field_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)option_field;
  option_field_local = (FieldDescriptor *)this;
  bVar1 = UninterpretedOption::has_aggregate_value(this->uninterpreted_option_);
  if (bVar1) {
    dynamic._M_t.
    super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
    .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::Message,_std::default_delete<google::protobuf::Message>,_true,_true>
          )FieldDescriptor::message_type((FieldDescriptor *)unknown_fields_local);
    pMVar4 = DynamicMessageFactory::GetPrototype
                       (&this->dynamic_factory_,
                        (Descriptor *)
                        dynamic._M_t.
                        super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
                        .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl);
    pMVar4 = Message::New(pMVar4);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_50,pMVar4);
    pMVar5 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get(&local_50);
    local_75 = 0;
    if (pMVar5 == (pointer)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x27e0,"dynamic.get() != nullptr");
      local_75 = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar6,(char (*) [33])"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_(&local_98,(FieldDescriptor *)unknown_fields_local);
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar6);
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((local_75 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    anon_unknown_24::AggregateErrorCollector::AggregateErrorCollector
              ((AggregateErrorCollector *)&finder.builder_);
    AggregateOptionFinder::AggregateOptionFinder((AggregateOptionFinder *)&parser.no_op_fields_);
    finder.super_Finder._vptr_Finder = (_func_int **)this->builder_;
    TextFormat::Parser::Parser((Parser *)local_108);
    TextFormat::Parser::RecordErrorsTo((Parser *)local_108,(ErrorCollector *)&finder.builder_);
    TextFormat::Parser::SetFinder((Parser *)local_108,(Finder *)&parser.no_op_fields_);
    this_00 = UninterpretedOption::aggregate_value_abi_cxx11_(this->uninterpreted_option_);
    local_118 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    pMVar5 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get(&local_50);
    bVar1 = TextFormat::Parser::ParseFromString((Parser *)local_108,local_118,pMVar5);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_160);
      this_01 = &std::
                 unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 ::operator->(&local_50)->super_MessageLite;
      MessageLite::SerializeToString(this_01,(string *)local_160);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      pUVar7 = local_28;
      if (TVar2 == TYPE_MESSAGE) {
        iVar3 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_160);
        local_168 = sVar8._M_str;
        absl_log_internal_check_op_result = (Nullable<const_char_*>)sVar8._M_len;
        UnknownFieldSet::AddLengthDelimited(pUVar7,iVar3,sVar8);
      }
      else {
        local_17c = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
        v1 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>
                       (&local_17c);
        local_180 = TYPE_GROUP;
        v2 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>
                       (&local_180);
        local_178 = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                              (v1,v2,"option_field->type() == FieldDescriptor::TYPE_GROUP");
        pUVar7 = local_28;
        if (local_178 != (Nullable<const_char_*>)0x0) {
          failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_178);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&group,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x27f6,failure_msg);
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)&group);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_181,pLVar6);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&group);
        }
        iVar3 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
        pUVar7 = UnknownFieldSet::AddGroup(pUVar7,iVar3);
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_160);
        UnknownFieldSet::ParseFromString(pUVar7,sVar8);
      }
      this_local._7_1_ = 1;
      serial.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_160);
    }
    else {
      local_138.option_field = (FieldDescriptor **)&unknown_fields_local;
      local_138.collector = (AggregateErrorCollector *)&finder.builder_;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_128,&local_138);
      AddValueError(this,local_128);
      this_local._7_1_ = 0;
      serial.field_2._12_4_ = 1;
    }
    TextFormat::Parser::~Parser((Parser *)local_108);
    AggregateOptionFinder::~AggregateOptionFinder((AggregateOptionFinder *)&parser.no_op_fields_);
    anon_unknown_24::AggregateErrorCollector::~AggregateErrorCollector
              ((AggregateErrorCollector *)&finder.builder_);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_50);
  }
  else {
    type = (Descriptor *)&unknown_fields_local;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_38,(anon_class_8_1_8974feae *)&type);
    this_local._7_1_ = AddValueError(this,local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError([&] {
      return absl::StrCat("Option \"", option_field->full_name(),
                          "\" is a message. "
                          "To set the entire message, use syntax like \"",
                          option_field->name(),
                          " = { <proto text format> }\". "
                          "To set fields within it, use syntax like \"",
                          option_field->name(), ".foo = value\".");
    });
  }

  const Descriptor* type = option_field->message_type();
  std::unique_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  ABSL_CHECK(dynamic.get() != nullptr)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError([&] {
      return absl::StrCat("Error while parsing option value for \"",
                          option_field->name(), "\": ", collector.error_);
    });
    return false;
  } else {
    std::string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      ABSL_CHECK_EQ(option_field->type(), FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}